

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O1

String __thiscall
testing::internal::GetBoolAssertionFailureMessage
          (internal *this,AssertionResult *assertion_result,char *expression_text,
          char *actual_predicate_value,char *expected_predicate_value)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ostream *in_RAX;
  size_t sVar2;
  size_t extraout_RDX;
  ostream *poVar4;
  pointer __s;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  sVar5;
  String SVar6;
  Message msg;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_38;
  size_t sVar3;
  
  pbVar1 = (assertion_result->message_).ptr_;
  if (pbVar1 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    __s = "";
  }
  else {
    __s = (pbVar1->_M_dataplus)._M_p;
  }
  local_38.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)in_RAX;
  Message::Message((Message *)&local_38);
  poVar4 = (ostream *)(local_38.ptr_ + 0x10);
  if (local_38.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"Value of: ",10);
  if (expression_text == (char *)0x0) {
    sVar5.ptr_ = local_38.ptr_ + 0x10;
    sVar2 = 6;
    expression_text = "(null)";
  }
  else {
    sVar5.ptr_ = local_38.ptr_;
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_38.ptr_ + 0x10);
    }
    sVar2 = strlen(expression_text);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)sVar5.ptr_,expression_text,sVar2);
  poVar4 = (ostream *)(local_38.ptr_ + 0x10);
  if (local_38.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n  Actual: ",0xb);
  if (actual_predicate_value == (char *)0x0) {
    sVar5.ptr_ = local_38.ptr_ + 0x10;
    sVar2 = 6;
    actual_predicate_value = "(null)";
  }
  else {
    sVar5.ptr_ = local_38.ptr_;
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_38.ptr_ + 0x10);
    }
    sVar2 = strlen(actual_predicate_value);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)sVar5.ptr_,actual_predicate_value,sVar2);
  if (*__s != '\0') {
    poVar4 = (ostream *)(local_38.ptr_ + 0x10);
    if (local_38.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4," (",2);
    poVar4 = (ostream *)(local_38.ptr_ + 0x10);
    if (local_38.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    sVar2 = strlen(__s);
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,__s,sVar2);
    poVar4 = (ostream *)(local_38.ptr_ + 0x10);
    if (local_38.ptr_ ==
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      poVar4 = (ostream *)0x0;
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,")",1);
  }
  poVar4 = (ostream *)(local_38.ptr_ + 0x10);
  if (local_38.ptr_ ==
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    poVar4 = (ostream *)0x0;
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\nExpected: ",0xb);
  if (expected_predicate_value == (char *)0x0) {
    sVar5.ptr_ = local_38.ptr_ + 0x10;
    sVar2 = 6;
    expected_predicate_value = "(null)";
  }
  else {
    sVar5.ptr_ = local_38.ptr_;
    if (local_38.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      sVar5.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   (local_38.ptr_ + 0x10);
    }
    sVar2 = strlen(expected_predicate_value);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)sVar5.ptr_,expected_predicate_value,sVar2);
  SVar6 = StringStreamToString(this,local_38.ptr_);
  sVar3 = SVar6.length_;
  if (local_38.ptr_ != (stringstream *)0x0) {
    (**(code **)(*(long *)local_38.ptr_ + 8))();
    sVar3 = extraout_RDX;
  }
  SVar6.length_ = sVar3;
  SVar6.c_str_ = (char *)this;
  return SVar6;
}

Assistant:

String GetBoolAssertionFailureMessage(const AssertionResult& assertion_result,
                                      const char* expression_text,
                                      const char* actual_predicate_value,
                                      const char* expected_predicate_value) {
  const char* actual_message = assertion_result.message();
  Message msg;
  msg << "Value of: " << expression_text
      << "\n  Actual: " << actual_predicate_value;
  if (actual_message[0] != '\0')
    msg << " (" << actual_message << ")";
  msg << "\nExpected: " << expected_predicate_value;
  return msg.GetString();
}